

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_brodnik.h
# Opt level: O1

void __thiscall vector_brodnik<unsigned_char_*>::grow(vector_brodnik<unsigned_char_*> *this)

{
  pointer *ppppuVar1;
  iterator __position;
  uchar **ppuVar2;
  
  if (this->_left_in_block == 0) {
    if (this->_left_in_superblock == 0) {
      if ((this->_superblock & 1) == 0) {
        this->_block_size = this->_block_size << 1;
      }
      else {
        this->_superblock_size = this->_superblock_size << 1;
      }
      this->_superblock = this->_superblock + 1;
      this->_left_in_superblock = this->_superblock_size;
    }
    ppuVar2 = (uchar **)malloc(this->_block_size << 3);
    this->_insertpos = ppuVar2;
    __position._M_current =
         (this->_index_block).
         super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->_index_block).super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char**,std::allocator<unsigned_char**>>::
      _M_realloc_insert<unsigned_char**const&>
                ((vector<unsigned_char**,std::allocator<unsigned_char**>> *)this,__position,
                 &this->_insertpos);
    }
    else {
      *__position._M_current = ppuVar2;
      ppppuVar1 = &(this->_index_block).
                   super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      *ppppuVar1 = *ppppuVar1 + 1;
    }
    this->_left_in_block = this->_block_size;
    this->_left_in_superblock = this->_left_in_superblock - 1;
    return;
  }
  __assert_fail("_left_in_block == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/vector_brodnik.h"
                ,0x56,"void vector_brodnik<unsigned char *>::grow() [T = unsigned char *]");
}

Assistant:

void grow()
	{
		assert(_left_in_block == 0);
		if (_left_in_superblock == 0) {
			if (_superblock&1) { _superblock_size *= 2; }
			else               { _block_size *= 2;      }
			++_superblock;
			_left_in_superblock = _superblock_size;
		}
		_insertpos = static_cast<T*>(malloc(_block_size*sizeof(T)));
		_index_block.push_back(_insertpos);
		_left_in_block = _block_size;
		--_left_in_superblock;
	}